

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall spv::Builder::~Builder(Builder *this)

{
  ~Builder(this);
  operator_delete(this,0xb88);
  return;
}

Assistant:

Builder::~Builder()
{
}